

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::FunctionObject::
binary<tcu::Matrix<double,_4,_2>,_tcu::Vector<double,_4>,_tcu::Vector<double,_2>_>::call
          (binary<tcu::Matrix<double,_4,_2>,_tcu::Vector<double,_4>,_tcu::Vector<double,_2>_> *this,
          GLvoid *result_dst,GLvoid *argument_src)

{
  code *pcVar1;
  Vector<double,_4> arg_1;
  Matrix<double,_4,_2> result;
  Vector<double,_4> local_d8;
  Matrix<double,_4,_2> local_b0;
  Matrix<double,_4,_2> local_70;
  
  GPUShaderFP64Test10::functionObject::getArgumentStride((functionObject *)this,0);
  pcVar1 = (code *)(this->super_binaryBase).super_functionObject.m_p_function;
  tcu::Vector<double,_4>::Vector(&local_d8);
  tcu::Matrix<double,_4,_2>::Matrix(&local_70);
  local_d8.m_data[0] = *argument_src;
  local_d8.m_data[1] = *(double *)((long)argument_src + 8);
  local_d8.m_data[2]._0_4_ = *(undefined4 *)((long)argument_src + 0x10);
  local_d8.m_data[2]._4_4_ = *(undefined4 *)((long)argument_src + 0x14);
  local_d8.m_data[3]._0_4_ = *(undefined4 *)((long)argument_src + 0x18);
  local_d8.m_data[3]._4_4_ = *(undefined4 *)((long)argument_src + 0x1c);
  (*pcVar1)(&local_b0,&local_d8);
  tcu::Matrix<double,_4,_2>::operator=(&local_70,&local_b0);
  pack<tcu::Matrix<double,_4,_2>_>::set(result_dst,&local_70);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		const glw::GLuint argument_1_stride = getArgumentStride(0);

		functionPointer p_function = (functionPointer)m_p_function;

		Arg1T arg_1;
		Arg2T arg_2;
		ResT  result;

		unpack<Arg1T>::get(argument_src, arg_1);
		unpack<Arg2T>::get((glw::GLubyte*)argument_src + argument_1_stride, arg_2);

		result = p_function(arg_1, arg_2);

		pack<ResT>::set(result_dst, result);
	}